

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsharedpointer_impl.h
# Opt level: O3

QWeakPointer<QObject> * __thiscall
QWeakPointer<QObject>::operator=(QWeakPointer<QObject> *this,QWeakPointer<QObject> *other)

{
  Data *pDVar1;
  QObject *pQVar2;
  Data *pDVar3;
  
  pDVar1 = other->d;
  pQVar2 = other->value;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->weakref)._q_value.super___atomic_base<int>._M_i =
         (pDVar1->weakref)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  pDVar3 = this->d;
  this->d = pDVar1;
  this->value = pQVar2;
  if (pDVar3 != (Data *)0x0) {
    LOCK();
    (pDVar3->weakref)._q_value.super___atomic_base<int>._M_i =
         (pDVar3->weakref)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar3->weakref)._q_value.super___atomic_base<int>._M_i == 0) {
      operator_delete(pDVar3);
    }
  }
  return this;
}

Assistant:

QWeakPointer &operator=(const QWeakPointer &other) noexcept
    {
        QWeakPointer copy(other);
        swap(copy);
        return *this;
    }